

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::MVNParameter::MVNParameter(MVNParameter *this,MVNParameter *from)

{
  void *pvVar1;
  bool bVar2;
  undefined2 uVar3;
  float fVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MVNParameter_006fa1d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  bVar2 = from->normalize_variance_;
  uVar3 = *(undefined2 *)&from->field_0x1a;
  fVar4 = from->eps_;
  this->across_channels_ = from->across_channels_;
  this->normalize_variance_ = bVar2;
  *(undefined2 *)&this->field_0x1a = uVar3;
  this->eps_ = fVar4;
  return;
}

Assistant:

MVNParameter::MVNParameter(const MVNParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&across_channels_, &from.across_channels_,
    reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&across_channels_) + sizeof(eps_));
  // @@protoc_insertion_point(copy_constructor:caffe.MVNParameter)
}